

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::DataCompare<unsigned_int>
          (DrawIndirectBase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataRef,
          uint widthRef,uint heightRef,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataTest
          ,uint widthTest,uint heightTest,uint offsetYRef,uint offsetYTest)

{
  uint uVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_type sVar6;
  runtime_error *prVar7;
  uint *puVar8;
  const_reference pvVar9;
  DILogger *pDVar10;
  uint local_36c;
  DILogger local_368;
  undefined1 local_1e8 [8];
  DIResult status;
  size_t j;
  uint offsetTest;
  uint offsetRef;
  uint i;
  uint height;
  uint width;
  uint local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_30;
  uint widthTest_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dataTest_local;
  uint heightRef_local;
  uint widthRef_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dataRef_local;
  DrawIndirectBase *this_local;
  
  local_34 = widthTest;
  pvStack_30 = dataTest;
  dataTest_local._0_4_ = heightRef;
  dataTest_local._4_4_ = widthRef;
  _heightRef_local = dataRef;
  dataRef_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(dataRef);
  if (sVar6 < widthRef * heightRef) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Invalid reference buffer resolution!");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = local_34 * heightTest;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_30);
  if (uVar3 <= sVar6) {
    puVar8 = std::min<unsigned_int>((uint *)((long)&dataTest_local + 4),&local_34);
    uVar3 = *puVar8;
    puVar8 = std::min<unsigned_int>((uint *)&dataTest_local,&heightTest);
    uVar1 = *puVar8;
    offsetTest = 0;
    do {
      if (uVar1 <= offsetTest) {
        return 0;
      }
      uVar4 = (offsetTest + offsetYRef) * dataTest_local._4_4_;
      uVar5 = (offsetTest + offsetYTest) * local_34;
      for (status.status_ = 0; (ulong)status.status_ < (ulong)uVar3;
          status.status_ = status.status_ + 1) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_heightRef_local,(ulong)uVar4 + status.status_);
        vVar2 = *pvVar9;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvStack_30,(ulong)uVar5 + status.status_);
        if (vVar2 != *pvVar9) {
          DIResult::DIResult((DIResult *)local_1e8);
          DIResult::error(&local_368,(DIResult *)local_1e8);
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<
                              ((DILogger *)&local_368,
                               (char (*) [38])"Compare failed: different values [x: ");
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<
                              ((DILogger *)pDVar10,(unsigned_long *)&status.status_);
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<
                              ((DILogger *)pDVar10,(char (*) [6])", y: ");
          local_36c = offsetTest + offsetYTest;
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<
                              ((DILogger *)pDVar10,&local_36c);
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<
                              ((DILogger *)pDVar10,(char (*) [14])", reference: ");
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (_heightRef_local,(ulong)uVar4 + status.status_);
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar10,pvVar9);
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<
                              ((DILogger *)pDVar10,(char (*) [9])", test: ");
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (pvStack_30,(ulong)uVar5 + status.status_);
          pDVar10 = glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)pDVar10,pvVar9);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)pDVar10,(char (*) [2])0x29dc08e);
          DILogger::~DILogger(&local_368);
          this_local = (DrawIndirectBase *)DIResult::code((DIResult *)local_1e8);
          DIResult::~DIResult((DIResult *)local_1e8);
          return (long)this_local;
        }
      }
      offsetTest = offsetTest + 1;
    } while( true );
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Invalid test buffer resolution!");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

long DataCompare(const std::vector<T>& dataRef, unsigned int widthRef, unsigned int heightRef,
					 const std::vector<T>& dataTest, unsigned int widthTest, unsigned int heightTest,
					 unsigned offsetYRef = 0, unsigned offsetYTest = 0)
	{
		if (widthRef * heightRef > dataRef.size())
			throw std::runtime_error("Invalid reference buffer resolution!");

		if (widthTest * heightTest > dataTest.size())
			throw std::runtime_error("Invalid test buffer resolution!");

		unsigned int width  = std::min(widthRef, widthTest);
		unsigned int height = std::min(heightRef, heightTest);

		for (unsigned int i = 0; i < height; ++i)
		{
			unsigned int offsetRef  = (i + offsetYRef) * widthRef;
			unsigned int offsetTest = (i + offsetYTest) * widthTest;

			for (size_t j = 0; j < width; ++j)
			{
				if (dataRef[offsetRef + j] != dataTest[offsetTest + j])
				{
					DIResult status;
					status.error() << "Compare failed: different values [x: " << j << ", y: " << i + offsetYTest
								   << ", reference: " << dataRef[offsetRef + j]
								   << ", test: " << dataTest[offsetTest + j] << "]";
					return status.code();
				}
			}
		}

		return NO_ERROR;
	}